

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

void __thiscall CInput::HandleJoystickAxisMotionEvent(CInput *this,SDL_Event *Event)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  iVar3 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    return;
  }
  if (*(Uint32 *)(CONCAT44(extraout_var,iVar3) + 0x78) != (Event->display).display) {
    return;
  }
  if (0xb < (Event->display).event) {
    return;
  }
  uVar2 = (uint)(Event->display).event * 2;
  uVar4 = (ulong)uVar2;
  fVar6 = (float)this->m_pConfig->m_JoystickTolerance / 50.0;
  fVar7 = fVar6 * -32768.0;
  if ((fVar7 < (float)(int)(Event->jaxis).value) || (this->m_aInputState[uVar4 + 0x1c2] != false)) {
    if (((float)(int)(Event->jaxis).value <= fVar7) || (this->m_aInputState[uVar4 + 0x1c2] != true))
    goto LAB_001297a7;
    this->m_aInputState[uVar4 + 0x1c2] = false;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar5 = (long)iVar3;
    if (lVar5 == 0x20) goto LAB_001297a7;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Key = uVar2 + 0x1c2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Flags = 2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_aText[0] = '\0';
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_InputCount =
         this->m_InputCounter;
  }
  else {
    this->m_aInputState[uVar4 + 0x1c2] = true;
    iVar1 = this->m_InputCounter;
    *(short *)(this->m_aInputState + uVar4 * 2 + -0x7c) = (short)iVar1;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar5 = (long)iVar3;
    if (lVar5 == 0x20) goto LAB_001297a7;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Key = uVar2 + 0x1c2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Flags = 1;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_aText[0] = '\0';
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_InputCount = iVar1;
  }
  (this->super_IEngineInput).super_IInput.m_NumEvents = iVar3 + 1;
LAB_001297a7:
  fVar6 = fVar6 * 32767.0;
  if (((float)(int)(Event->jaxis).value < fVar6) || (this->m_aInputState[uVar4 + 0x1c3] != false)) {
    if (fVar6 <= (float)(int)(Event->jaxis).value) {
      return;
    }
    if (this->m_aInputState[uVar4 + 0x1c3] != true) {
      return;
    }
    this->m_aInputState[uVar4 + 0x1c3] = false;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar5 = (long)iVar3;
    if (lVar5 == 0x20) {
      return;
    }
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Key = uVar2 + 0x1c3;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Flags = 2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_aText[0] = '\0';
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_InputCount =
         this->m_InputCounter;
  }
  else {
    this->m_aInputState[uVar4 + 0x1c3] = true;
    iVar1 = this->m_InputCounter;
    *(short *)(this->m_aInputState + uVar4 * 2 + -0x7a) = (short)iVar1;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar5 = (long)iVar3;
    if (lVar5 == 0x20) {
      return;
    }
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Key = uVar2 + 0x1c3;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Flags = 1;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_aText[0] = '\0';
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_InputCount = iVar1;
  }
  (this->super_IEngineInput).super_IInput.m_NumEvents = iVar3 + 1;
  return;
}

Assistant:

void CInput::HandleJoystickAxisMotionEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jaxis.which)
		return;
	if(Event.jaxis.axis >= NUM_JOYSTICK_AXES)
		return;

	const int LeftKey = KEY_JOY_AXIS_0_LEFT + 2 * Event.jaxis.axis;
	const int RightKey = LeftKey + 1;
	const float DeadZone = GetJoystickDeadzone();

	if(Event.jaxis.value <= SDL_JOYSTICK_AXIS_MIN * DeadZone && !m_aInputState[LeftKey])
	{
		m_aInputState[LeftKey] = true;
		m_aInputCount[LeftKey] = m_InputCounter;
		AddEvent(0, LeftKey, IInput::FLAG_PRESS);
	}
	else if(Event.jaxis.value > SDL_JOYSTICK_AXIS_MIN * DeadZone && m_aInputState[LeftKey])
	{
		m_aInputState[LeftKey] = false;
		AddEvent(0, LeftKey, IInput::FLAG_RELEASE);
	}

	if(Event.jaxis.value >= SDL_JOYSTICK_AXIS_MAX * DeadZone && !m_aInputState[RightKey])
	{
		m_aInputState[RightKey] = true;
		m_aInputCount[RightKey] = m_InputCounter;
		AddEvent(0, RightKey, IInput::FLAG_PRESS);
	}
	else if(Event.jaxis.value < SDL_JOYSTICK_AXIS_MAX * DeadZone && m_aInputState[RightKey])
	{
		m_aInputState[RightKey] = false;
		AddEvent(0, RightKey, IInput::FLAG_RELEASE);
	}
}